

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

bool __thiscall nonius::detail::option::matches_long(option *this,string *s,string *arg)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  _Alloc_hider local_28;
  char local_20;
  
  long_separator((option *)&stack0xffffffffffffffd8,&this->long_form);
  if (local_20 == '\x01') {
    __last._M_current = (s->_M_dataplus)._M_p + s->_M_string_length;
    if (__last._M_current == local_28._M_p) {
      return true;
    }
    if (*local_28._M_p == '=') {
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)arg,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_28._M_p + 1),__last);
      return true;
    }
  }
  return false;
}

Assistant:

bool matches_long(std::string const& s, std::string& arg) const {
                bool match; std::string::const_iterator it;
                std::tie(match, it) = long_separator(s);
                if(match && it != s.end()) {
                    if(*it == '=') arg.assign(it+1, s.end());
                    else return false;
                }
                return match;
            }